

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::_InternalParse
          (CodeGeneratorResponse *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  internal *this_00;
  char *size;
  Rep *pRVar3;
  bool bVar4;
  string *s;
  CodeGeneratorResponse_File *obj;
  MessageLite *msg;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  undefined8 *puVar8;
  UnknownFieldSet *unknown;
  byte *p;
  char cVar9;
  uint uVar10;
  pair<const_char_*,_unsigned_int> pVar11;
  pair<const_char_*,_unsigned_long> pVar12;
  StringPiece str;
  byte *local_48;
  InternalMetadata *local_40;
  ArenaStringPtr *local_38;
  char *field_name;
  
  local_48 = (byte *)ptr;
  bVar4 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
  uVar7 = 0;
  if (!bVar4) {
    local_40 = &(this->super_Message).super_MessageLite._internal_metadata_;
    local_38 = &this->error_;
    uVar7 = 0;
    do {
      bVar1 = *local_48;
      uVar10 = (uint)bVar1;
      p = local_48 + 1;
      if ((char)bVar1 < '\0') {
        uVar10 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar11 = internal::ReadTagFallback((char *)local_48,uVar10);
          p = (byte *)pVar11.first;
          uVar10 = pVar11.second;
        }
        else {
          p = local_48 + 2;
        }
      }
      uVar5 = uVar10 >> 3;
      field_name = (char *)(ulong)uVar5;
      cVar9 = (char)uVar10;
      local_48 = p;
      if (uVar5 != 0xf) {
        if (uVar5 == 2) {
          if (cVar9 == '\x10') {
            uVar7 = 2;
            uVar6 = (ulong)(char)*p;
            local_48 = p + 1;
            if ((long)uVar6 < 0) {
              uVar10 = ((uint)*local_48 * 0x80 + (uint)*p) - 0x80;
              if ((char)*local_48 < '\0') {
                local_48 = p;
                pVar12 = internal::VarintParseSlow64((char *)p,uVar10);
                local_48 = (byte *)pVar12.first;
                this->supported_features_ = pVar12.second;
                goto joined_r0x0028397c;
              }
              uVar6 = (ulong)uVar10;
              local_48 = p + 2;
            }
            this->supported_features_ = uVar6;
            goto LAB_00283a80;
          }
LAB_00283a3b:
          if ((uVar10 != 0) && ((uVar10 & 7) != 4)) {
            if ((local_40->ptr_ & 1U) == 0) {
              unknown = internal::InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_40);
            }
            else {
              unknown = (UnknownFieldSet *)((local_40->ptr_ & 0xfffffffffffffffcU) + 8);
            }
            local_48 = (byte *)internal::UnknownFieldParse
                                         ((ulong)uVar10,unknown,(char *)local_48,ctx);
            goto joined_r0x0028397c;
          }
          if (p != (byte *)0x0) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar10 - 1;
            break;
          }
        }
        else {
          if ((uVar5 != 1) || (cVar9 != '\n')) goto LAB_00283a3b;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
          puVar8 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
          if ((uVar6 & 1) != 0) {
            puVar8 = (undefined8 *)*puVar8;
          }
          s = internal::ArenaStringPtr::Mutable_abi_cxx11_(local_38,puVar8);
          local_48 = (byte *)internal::InlineGreedyStringParser(s,(char *)local_48,ctx);
          this_00 = (internal *)(s->_M_dataplus)._M_p;
          size = (char *)s->_M_string_length;
          if ((long)size < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      ((size_t)size,"string length exceeds max size");
          }
          str.length_ = (size_type)"google.protobuf.compiler.CodeGeneratorResponse.error";
          str.ptr_ = size;
          internal::VerifyUTF8(this_00,str,field_name);
joined_r0x0028397c:
          if (local_48 != (byte *)0x0) goto LAB_00283a80;
        }
LAB_00283aee:
        local_48 = (byte *)0x0;
        break;
      }
      if (cVar9 != 'z') goto LAB_00283a3b;
      local_48 = p + -1;
      do {
        local_48 = local_48 + 1;
        pRVar3 = (this->file_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar3 == (Rep *)0x0) {
LAB_002839fd:
          obj = Arena::CreateMaybeMessage<google::protobuf::compiler::CodeGeneratorResponse_File>
                          ((this->file_).super_RepeatedPtrFieldBase.arena_);
          msg = (MessageLite *)
                internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                          (&(this->file_).super_RepeatedPtrFieldBase,obj);
        }
        else {
          iVar2 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar3->allocated_size <= iVar2) goto LAB_002839fd;
          (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
          msg = (MessageLite *)pRVar3->elements[iVar2];
        }
        local_48 = (byte *)internal::ParseContext::ParseMessage(ctx,msg,(char *)local_48);
        if (local_48 == (byte *)0x0) goto LAB_00283aee;
      } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == 0x7a));
LAB_00283a80:
      bVar4 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
    } while (!bVar4);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar7;
  return (char *)local_48;
}

Assistant:

const char* CodeGeneratorResponse::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional string error = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_error();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.error");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional uint64 supported_features = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _Internal::set_has_supported_features(&has_bits);
          supported_features_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}